

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O1

void resampler_remove_sample(void *_r,int decay)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  
  iVar1 = *(int *)((long)_r + 0xc);
  if (0 < iVar1) {
    if ((*(byte *)((long)_r + 0x30) | 2) == 3) {
      dVar3 = (double)*(float *)((long)_r + (long)*(int *)((long)_r + 8) * 4 + 0x248) +
              *(double *)((long)_r + 0x40);
      *(double *)((long)_r + 0x40) = dVar3;
      *(undefined4 *)((long)_r + (long)*(int *)((long)_r + 8) * 4 + 0x248) = 0;
      if ((decay != 0) &&
         (dVar3 = dVar3 * 0.9998779296875, *(double *)((long)_r + 0x40) = dVar3,
         ABS(dVar3) < 9.999999682655225e-21)) {
        *(undefined8 *)((long)_r + 0x40) = 0;
      }
    }
    *(int *)((long)_r + 0xc) = iVar1 + -1;
    iVar1 = *(int *)((long)_r + 8);
    uVar2 = iVar1 + 0x40;
    if (-1 < (int)(iVar1 + 1U)) {
      uVar2 = iVar1 + 1U;
    }
    *(uint *)((long)_r + 8) = (iVar1 - (uVar2 & 0xffffffc0)) + 1;
  }
  return;
}

Assistant:

void resampler_remove_sample(void *_r, int decay)
{
    resampler * r = ( resampler * ) _r;
    if ( r->read_filled > 0 )
    {
        if ( r->quality == RESAMPLER_QUALITY_BLEP || r->quality == RESAMPLER_QUALITY_BLAM )
        {
            r->accumulator += r->buffer_out[ r->read_pos ];
            r->buffer_out[ r->read_pos ] = 0;
            if (decay)
            {
                r->accumulator -= r->accumulator * (1.0f / 8192.0f);
                if (fabs(r->accumulator) < 1e-20f)
                    r->accumulator = 0;
            }
        }
        --r->read_filled;
        r->read_pos = ( r->read_pos + 1 ) % resampler_buffer_size;
    }
}